

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

BGwCI_sharedPtr __thiscall
BayesianGameWithClusterInfo::ConstructExtendedBGWCI
          (BayesianGameWithClusterInfo *this,BGwCI_constPtr *pBG,JointPolicyDiscretePure *prevJPolBG
          ,QFunctionJAOHInterface *q)

{
  Index IVar1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  PlanningUnitDecPOMDPDiscrete *pu;
  element_type *peVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  BayesianGameWithClusterInfo *this_00;
  undefined4 extraout_var_01;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar6;
  ulong uVar7;
  BGwCI_sharedPtr BVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  shared_ptr<JointPolicyDiscretePure> prevJPolBGptr;
  shared_ptr<const_JointPolicyDiscretePure> local_48;
  QFunctionJAOHInterface *local_38;
  
  IVar1 = (pBG->px->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
          _m_t;
  local_38 = q;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&nrTypes,&(pBG->px->super_BayesianGameForDecPOMDPStage).
                       super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface.
                       super_BayesianGameBase._m_nrTypes);
  uVar7 = 0;
  while( true ) {
    iVar4 = (*(pBG->px->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])
                      (&(pBG->px->super_BayesianGameForDecPOMDPStage).
                        super_BayesianGameIdenticalPayoff);
    if (CONCAT44(extraout_var,iVar4) <= uVar7) {
      iVar4 = (*(prevJPolBG->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[5])
                        (prevJPolBG);
      boost::shared_ptr<JointPolicyDiscretePure>::shared_ptr<JointPolicyDiscretePure>
                (&prevJPolBGptr,(JointPolicyDiscretePure *)CONCAT44(extraout_var_00,iVar4));
      this_00 = (BayesianGameWithClusterInfo *)operator_new(0x1c8);
      pu = (pBG->px->super_BayesianGameForDecPOMDPStage)._m_pu;
      local_48.px = &(prevJPolBGptr.px)->super_JointPolicyDiscretePure;
      local_48.pn.pi_ = prevJPolBGptr.pn.pi_;
      if (prevJPolBGptr.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (prevJPolBGptr.pn.pi_)->use_count_ = (prevJPolBGptr.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      iVar4 = (*(pBG->px->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])
                        (&(pBG->px->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameIdenticalPayoff);
      peVar3 = pBG->px;
      BayesianGameWithClusterInfo
                (this_00,pu,local_38,IVar1 + 1,pBG,&local_48,CONCAT44(extraout_var_01,iVar4),
                 &(peVar3->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                  super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrActions,
                 &nrTypes,peVar3->_m_clusterAlgorithm,peVar3->_m_thresholdJB,
                 peVar3->_m_thresholdPjaoh);
      boost::shared_ptr<BayesianGameWithClusterInfo>::shared_ptr<BayesianGameWithClusterInfo>
                ((shared_ptr<BayesianGameWithClusterInfo> *)this,this_00);
      boost::detail::shared_count::~shared_count(&local_48.pn);
      Extend((BayesianGameWithClusterInfo *)
             (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
             _vptr_BayesianGameForDecPOMDPStageInterface);
      boost::detail::shared_count::~shared_count(&prevJPolBGptr.pn);
      sVar6.pi_ = extraout_RDX;
      if (nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)nrTypes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)nrTypes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        sVar6.pi_ = extraout_RDX_00;
      }
      BVar8.pn.pi_ = sVar6.pi_;
      BVar8.px = this;
      return BVar8;
    }
    pMVar2 = (((pBG->px->super_BayesianGameForDecPOMDPStage)._m_pu)->super_PlanningUnitMADPDiscrete)
             ._m_madp;
    lVar5 = (**(code **)((long)*pMVar2 + 0xc0))(pMVar2,uVar7);
    if ((ulong)((long)nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar7) break;
    nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7] =
         lVar5 * nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
    uVar7 = (ulong)((int)uVar7 + 1);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
}

Assistant:

BGwCI_sharedPtr 
BayesianGameWithClusterInfo::ConstructExtendedBGWCI(
        const BGwCI_constPtr &pBG,
        const JointPolicyDiscretePure& prevJPolBG,
        //const JointPolicyPureVector& prevJPolBG,
        const QFunctionJAOHInterface* q
 )
{
    //compute extended individual histories for each agent
    Index t = pBG->GetStage()+1;
    vector<size_t> nrTypes = pBG->GetNrTypes();   
    //each agent will form newtype = <type, action, observation>
    //tuples. Since the action is fixed (by prevJPolBG), the number of new
    //types for agent i is: nrTypes_i * nrObservations_i
    for(Index agI=0; agI < pBG->GetNrAgents(); agI++)
        nrTypes.at(agI) *= pBG->GetPUDecPOMDPDiscrete()->GetNrObservations(agI);

    boost::shared_ptr<JointPolicyDiscretePure> prevJPolBGptr=
        boost::shared_ptr<JointPolicyDiscretePure>(prevJPolBG.Clone());
    BGwCI_sharedPtr bg(new BayesianGameWithClusterInfo(
                           pBG->GetPUDecPOMDPDiscrete(), q, t,
                           pBG,
                           prevJPolBGptr, 
                           pBG->GetNrAgents(),
                           pBG->GetNrActions(),
                           nrTypes,
                           pBG->GetClusterAlgorithm(),
                           pBG->GetThresholdJB(),
                           pBG->GetThresholdPjaoh()
                           ));

    bg->Extend();
    //return the newly constructed bg
    return(bg);
}